

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

size_t small_round(size_t size)

{
  long lVar1;
  size_t r;
  size_t size_local;
  
  size_local = size;
  if (1 < size) {
    if (0x8000000000000000 < size) {
      __assert_fail("size <= SIZE_MAX / 2 + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/util.h"
                    ,0x96,"size_t small_round(size_t)");
    }
    lVar1 = 0x3f;
    if (size - 1 != 0) {
      for (; size - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    size_local = 1L << (0x40 - ((byte)lVar1 ^ 0x3f) & 0x3f);
  }
  return size_local;
}

Assistant:

static inline size_t
small_round(size_t size)
{
	if (size < 2)
		return size;
	assert(size <= SIZE_MAX / 2 + 1);
	assert(size - 1 <= ULONG_MAX);
	size_t r = 1;
	return r << (sizeof(unsigned long) * CHAR_BIT -
		     __builtin_clzl((unsigned long) (size - 1)));
}